

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::OnCatch(TypeChecker *this)

{
  iterator __position;
  Result RVar1;
  Enum EVar2;
  Result RVar3;
  byte bVar4;
  Label *local_40;
  Label *label;
  
  RVar1 = GetLabel(this,0,&local_40);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    label._7_1_ = local_40->label_type != Try;
    RVar1 = PopAndCheckSignature(this,&local_40->result_types,"try block");
    RVar3 = CheckTypeStackEnd(this,"try block");
    bVar4 = (RVar3.enum_ == Error || RVar1.enum_ == Error) | label._7_1_;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
              (&this->type_stack_,local_40->type_stack_limit);
    local_40->label_type = Catch;
    local_40->unreachable = false;
    label._0_4_ = 0xffffffe8;
    __position._M_current =
         (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
                ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,__position,
                 (Type *)&label);
    }
    else {
      *__position._M_current = ExceptRef;
      (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    EVar2 = (Enum)bVar4;
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::OnCatch() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::Try);
  result |= PopAndCheckSignature(label->result_types, "try block");
  result |= CheckTypeStackEnd("try block");
  ResetTypeStackToLabel(label);
  label->label_type = LabelType::Catch;
  label->unreachable = false;
  PushType(Type::ExceptRef);
  return result;
}